

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

MessageLite *
google::protobuf::internal::GetOwnedMessageInternal
          (Arena *message_arena,MessageLite *submessage,Arena *submessage_arena)

{
  int iVar1;
  undefined4 extraout_var;
  MessageLite *pMVar2;
  
  if (submessage_arena == (Arena *)0x0 && message_arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::MessageLite>(message_arena,submessage);
    pMVar2 = submessage;
  }
  else {
    iVar1 = (*submessage->_vptr_MessageLite[4])(submessage);
    pMVar2 = (MessageLite *)CONCAT44(extraout_var,iVar1);
    (*pMVar2->_vptr_MessageLite[8])(pMVar2,submessage);
  }
  return pMVar2;
}

Assistant:

MessageLite* GetOwnedMessageInternal(Arena* message_arena,
                                     MessageLite* submessage,
                                     Arena* submessage_arena) {
  GOOGLE_DCHECK(submessage->GetArena() == submessage_arena);
  GOOGLE_DCHECK(message_arena != submessage_arena);
  if (message_arena != NULL && submessage_arena == NULL) {
    message_arena->Own(submessage);
    return submessage;
  } else {
    MessageLite* ret = submessage->New(message_arena);
    ret->CheckTypeAndMergeFrom(*submessage);
    return ret;
  }
}